

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

channel_s * fio_channel_find_dup_internal(channel_s *ch_tmp,uint64_t hashed,fio_collection_s *c)

{
  fio_lock_i *lock;
  fio_ch_set__map_s_ *pfVar1;
  channel_s *pcVar2;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  lock = &c->lock;
  fio_lock(lock);
  pfVar1 = fio_ch_set__find_map_pos_(&c->channels,hashed,ch_tmp);
  if (((pfVar1 == (fio_ch_set__map_s_ *)0x0) || (pfVar1->pos == (fio_ch_set__ordered_s_ *)0x0)) ||
     (pcVar2 = pfVar1->pos->obj, pcVar2 == (channel_s *)0x0)) {
    LOCK();
    *lock = '\0';
    UNLOCK();
    pcVar2 = (channel_s *)0x0;
  }
  else {
    LOCK();
    pcVar2->ref = pcVar2->ref + 1;
    UNLOCK();
    LOCK();
    *lock = '\0';
    UNLOCK();
  }
  return pcVar2;
}

Assistant:

static channel_s *fio_channel_find_dup_internal(channel_s *ch_tmp,
                                                uint64_t hashed,
                                                fio_collection_s *c) {
  fio_lock(&c->lock);
  channel_s *ch = fio_ch_set_find(&c->channels, hashed, ch_tmp);
  if (!ch) {
    fio_unlock(&c->lock);
    return NULL;
  }
  fio_channel_dup(ch);
  fio_unlock(&c->lock);
  return ch;
}